

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

bool __thiscall adios2::IO::RemoveAttribute(IO *this,string *name)

{
  IO *pointer;
  bool bVar1;
  string local_48;
  
  pointer = this->m_IO;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to IO::RemoveAttribute","");
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  bVar1 = (bool)adios2::core::IO::RemoveAttribute((string *)this->m_IO);
  return bVar1;
}

Assistant:

bool IO::RemoveAttribute(const std::string &name)
{
    helper::CheckForNullptr(m_IO, "in call to IO::RemoveAttribute");
    return m_IO->RemoveAttribute(name);
}